

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O3

void __thiscall
wallet::CWallet::
WalletLogPrintf<long,int,int,int,std::__cxx11::string,double,double,double,double,double,double,double,double,double,double,double,double,double,double,double>
          (CWallet *this,char *fmt,long parameters,int parameters_1,int parameters_2,
          int parameters_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_4,
          double parameters_5,double parameters_6,double parameters_7,double parameters_8,
          double parameters_9,double parameters_10,double parameters_11,double parameters_12,
          double parameters_13,double parameters_14,double parameters_15,double parameters_16,
          double parameters_17,double parameters_18,double parameters_19)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Logger *pLVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  tinyformat *this_00;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  double *args_20;
  allocator<char> local_199;
  double parameters_local_11;
  double parameters_local_10;
  double parameters_local_9;
  double parameters_local_8;
  double parameters_local_7;
  double parameters_local_6;
  double parameters_local_5;
  double parameters_local_4;
  int parameters_local_3;
  int parameters_local_2;
  int parameters_local_1;
  long parameters_local;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  tinyformat *local_f8;
  size_type local_f0;
  size_type local_e8;
  undefined8 uStack_e0;
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parameters_local_11 = parameters_12;
  parameters_local_10 = parameters_11;
  parameters_local_9 = parameters_10;
  parameters_local_8 = parameters_9;
  parameters_local_7 = parameters_8;
  parameters_local_6 = parameters_7;
  parameters_local_5 = parameters_6;
  parameters_local_4 = parameters_5;
  parameters_local_3 = parameters_3;
  parameters_local_2 = parameters_2;
  parameters_local_1 = parameters_1;
  parameters_local = parameters;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,fmt,&local_199);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_118,0,0,"%s ",3);
  this_00 = (tinyformat *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if (this_00 == (tinyformat *)paVar5) {
    local_e8 = paVar5->_M_allocated_capacity;
    uStack_e0 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    this_00 = (tinyformat *)&local_e8;
  }
  else {
    local_e8 = paVar5->_M_allocated_capacity;
  }
  local_f0 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_f8 = this_00;
  GetDisplayName_abi_cxx11_((string *)&local_138,this);
  pLVar4 = LogInstance();
  args_20 = (double *)0x247087;
  bVar2 = BCLog::Logger::Enabled(pLVar4);
  if (bVar2) {
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    tinyformat::
    format<std::__cxx11::string,long,int,int,int,std::__cxx11::string,double,double,double,double,double,double,double,double,double,double,double,double,double,double,double>
              (&local_78,this_00,local_138._M_local_buf,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &parameters_local,(long *)&parameters_local_1,&parameters_local_2,&parameters_local_3
               ,(int *)parameters_4._M_dataplus._M_p,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &parameters_local_4,&parameters_local_5,&parameters_local_6,&parameters_local_7,
               &parameters_local_8,&parameters_local_9,&parameters_local_10,&parameters_local_11,
               (double *)&parameters_4._M_string_length,
               (double *)&parameters_4.field_2._M_allocated_capacity,
               (double *)((long)&parameters_4.field_2 + 8),&parameters_13,&parameters_14,
               &parameters_15,&parameters_16,args_20);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    pLVar4 = LogInstance();
    local_78._M_dataplus._M_p = (pointer)0x58;
    local_78._M_string_length = 0x4908cb;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h";
    source_file._M_len = 0x58;
    str._M_str = log_msg._M_dataplus._M_p;
    str._M_len = log_msg._M_string_length;
    logging_function._M_str = "WalletLogPrintf";
    logging_function._M_len = 0xf;
    BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x3a4,ALL,Info);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)log_msg._M_dataplus._M_p != &log_msg.field_2) {
      operator_delete(log_msg._M_dataplus._M_p,
                      CONCAT71(log_msg.field_2._M_allocated_capacity._1_7_,
                               log_msg.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_allocated_capacity != &local_128) {
    operator_delete((void *)local_138._M_allocated_capacity,local_128._M_allocated_capacity + 1);
  }
  if (local_f8 != (tinyformat *)&local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WalletLogPrintf(const char* fmt, Params... parameters) const
    {
        LogPrintf(("%s " + std::string{fmt}).c_str(), GetDisplayName(), parameters...);
    }